

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pCVar1;
  pointer pCVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *pVVar6;
  char *__dest;
  ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *pVVar7;
  double dVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_678;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_648;
  allocator<char> local_629;
  value_type local_628;
  allocator<char> local_601;
  value_type local_600;
  allocator<char> local_5d9;
  value_type local_5d8;
  undefined1 local_5b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segy_files_1;
  value_type local_598;
  undefined1 local_578 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  csv_files_1;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  undefined1 local_4e8 [8];
  CombinedSeismogramm<float,_3> s_1;
  char *segy_file_z;
  char *segy_file_y_1;
  char *segy_file_x_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  allocator<char> local_419;
  value_type local_418;
  allocator<char> local_3f1;
  value_type local_3f0;
  undefined1 local_3d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segy_files;
  value_type local_3b0;
  undefined1 local_390 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  csv_files;
  string local_370;
  allocator<char> local_339;
  string local_338;
  undefined1 local_318 [8];
  CombinedSeismogramm<float,_2> s;
  char *segy_file_y;
  char *segy_file_x;
  option long_opt [7];
  char *short_opt;
  int c;
  float interpolation_coef;
  char segy_file [200];
  char local_f8 [8];
  char csv_file [200];
  uint local_24;
  char *pcStack_20;
  int dims;
  char *convertion;
  char **argv_local;
  int argc_local;
  
  pcStack_20 = "tosegy";
  local_24 = 2;
  memcpy(local_f8,"csv_file",200);
  memcpy(&c,"segy_file",200);
  short_opt._4_4_ = 1.0;
  _opterr = 0;
  long_opt[6]._24_8_ = anon_var_dwarf_609b;
  memcpy(&segy_file_x,&PTR_anon_var_dwarf_60b1_00126b70,0xe0);
  while( true ) {
    do {
      uVar3 = getopt_long(argc,argv,long_opt[6]._24_8_,&segy_file_x,0);
      if (uVar3 == 0xffffffff) {
        if ((local_24 == 2) || (local_24 == 3)) {
          iVar4 = strcmp(pcStack_20,"tosegy");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcStack_20,"tocsv"), iVar4 == 0)) {
            if (local_24 == 2) {
              pcVar5 = strdup((char *)&c);
              strcat(pcVar5,"_x.segy");
              s.componentInfos.
              super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)strdup((char *)&c);
              strcat((char *)s.componentInfos.
                             super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"_y.segy");
              CombinedSeismogramm<float,_2>::CombinedSeismogramm
                        ((CombinedSeismogramm<float,_2> *)local_318,short_opt._4_4_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_338,pcVar5,&local_339);
              pVVar6 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
              pVVar6->_vptr_ValueGetter = (_func_int **)0x0;
              VxGetter<CombinedSeismogramm<float,_2>::Elastic,_2>::VxGetter
                        ((VxGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)pVVar6);
              CombinedSeismogramm<float,_2>::AddComponent
                        ((CombinedSeismogramm<float,_2> *)local_318,&local_338,pVVar6);
              std::__cxx11::string::~string((string *)&local_338);
              std::allocator<char>::~allocator(&local_339);
              pCVar2 = s.componentInfos.
                       super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_370,(char *)pCVar2,
                         (allocator<char> *)
                         ((long)&csv_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              pVVar6 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
              pVVar6->_vptr_ValueGetter = (_func_int **)0x0;
              VyGetter<CombinedSeismogramm<float,_2>::Elastic,_2>::VyGetter
                        ((VyGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)pVVar6);
              CombinedSeismogramm<float,_2>::AddComponent
                        ((CombinedSeismogramm<float,_2> *)local_318,&local_370,pVVar6);
              std::__cxx11::string::~string((string *)&local_370);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&csv_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_390);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3b0,local_f8,
                         (allocator<char> *)
                         ((long)&segy_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_390,&local_3b0);
              std::__cxx11::string::~string((string *)&local_3b0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&segy_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3d0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3f0,pcVar5,&local_3f1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3d0,&local_3f0);
              std::__cxx11::string::~string((string *)&local_3f0);
              std::allocator<char>::~allocator(&local_3f1);
              pCVar2 = s.componentInfos.
                       super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_418,(char *)pCVar2,&local_419);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3d0,&local_418);
              std::__cxx11::string::~string((string *)&local_418);
              std::allocator<char>::~allocator(&local_419);
              iVar4 = strcmp(pcStack_20,"tosegy");
              if (iVar4 == 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_438,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_390);
                CombinedSeismogramm<float,_2>::Load
                          ((CombinedSeismogramm<float,_2> *)local_318,CSV,&local_438);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_438);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_450,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3d0);
                CombinedSeismogramm<float,_2>::Save
                          ((CombinedSeismogramm<float,_2> *)local_318,SEG_Y,&local_450);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_450);
              }
              else {
                iVar4 = strcmp(pcStack_20,"tocsv");
                if (iVar4 == 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_468,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_3d0);
                  CombinedSeismogramm<float,_2>::Load
                            ((CombinedSeismogramm<float,_2> *)local_318,SEG_Y,&local_468);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_468);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&segy_file_x_1,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_390);
                  CombinedSeismogramm<float,_2>::Save
                            ((CombinedSeismogramm<float,_2> *)local_318,CSV,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&segy_file_x_1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&segy_file_x_1);
                }
              }
              free(pcVar5);
              free(s.componentInfos.
                   super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3d0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_390);
              CombinedSeismogramm<float,_2>::~CombinedSeismogramm
                        ((CombinedSeismogramm<float,_2> *)local_318);
            }
            else if (local_24 == 3) {
              pcVar5 = strdup((char *)&c);
              strcat(pcVar5,"_x.segy");
              __dest = strdup((char *)&c);
              strcat(__dest,"_y.segy");
              s_1.componentInfos.
              super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)strdup((char *)&c);
              strcat((char *)s_1.componentInfos.
                             super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"_z.segy");
              CombinedSeismogramm<float,_3>::CombinedSeismogramm
                        ((CombinedSeismogramm<float,_3> *)local_4e8,short_opt._4_4_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_508,pcVar5,&local_509);
              pVVar7 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar7->_vptr_ValueGetter = (_func_int **)0x0;
              VxGetter<CombinedSeismogramm<float,_3>::Elastic,_3>::VxGetter
                        ((VxGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)pVVar7);
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)local_4e8,&local_508,pVVar7);
              std::__cxx11::string::~string((string *)&local_508);
              std::allocator<char>::~allocator(&local_509);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_530,__dest,&local_531);
              pVVar7 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar7->_vptr_ValueGetter = (_func_int **)0x0;
              VyGetter<CombinedSeismogramm<float,_3>::Elastic,_3>::VyGetter
                        ((VyGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)pVVar7);
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)local_4e8,&local_530,pVVar7);
              std::__cxx11::string::~string((string *)&local_530);
              std::allocator<char>::~allocator(&local_531);
              pCVar1 = s_1.componentInfos.
                       super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_558,(char *)pCVar1,
                         (allocator<char> *)
                         ((long)&csv_files_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              pVVar7 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar7->_vptr_ValueGetter = (_func_int **)0x0;
              VzGetter<CombinedSeismogramm<float,_3>::Elastic,_3>::VzGetter
                        ((VzGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)pVVar7);
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)local_4e8,&local_558,pVVar7);
              std::__cxx11::string::~string((string *)&local_558);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&csv_files_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_578);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_598,local_f8,
                         (allocator<char> *)
                         ((long)&segy_files_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_578,&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&segy_files_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5b8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5d8,pcVar5,&local_5d9);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5b8,&local_5d8);
              std::__cxx11::string::~string((string *)&local_5d8);
              std::allocator<char>::~allocator(&local_5d9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_600,__dest,&local_601);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5b8,&local_600);
              std::__cxx11::string::~string((string *)&local_600);
              std::allocator<char>::~allocator(&local_601);
              pCVar1 = s_1.componentInfos.
                       super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_628,(char *)pCVar1,&local_629);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_5b8,&local_628);
              std::__cxx11::string::~string((string *)&local_628);
              std::allocator<char>::~allocator(&local_629);
              iVar4 = strcmp(pcStack_20,"tosegy");
              if (iVar4 == 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_648,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_578);
                CombinedSeismogramm<float,_3>::Load
                          ((CombinedSeismogramm<float,_3> *)local_4e8,CSV,&local_648);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_648);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_660,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_5b8);
                CombinedSeismogramm<float,_3>::Save
                          ((CombinedSeismogramm<float,_3> *)local_4e8,SEG_Y,&local_660);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_660);
              }
              else {
                iVar4 = strcmp(pcStack_20,"tocsv");
                if (iVar4 == 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_678,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_5b8);
                  CombinedSeismogramm<float,_3>::Load
                            ((CombinedSeismogramm<float,_3> *)local_4e8,SEG_Y,&local_678);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_678);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_690,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_578);
                  CombinedSeismogramm<float,_3>::Save
                            ((CombinedSeismogramm<float,_3> *)local_4e8,CSV,&local_690);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_690);
                }
              }
              free(pcVar5);
              free(__dest);
              free(s_1.componentInfos.
                   super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_578);
              CombinedSeismogramm<float,_3>::~CombinedSeismogramm
                        ((CombinedSeismogramm<float,_3> *)local_4e8);
            }
            argv_local._4_4_ = 0;
          }
          else {
            fprintf(_stderr,
                    "Invalid value for option convertion (should be equal to \"tosegy\" or \"tocsv\", but equal to %s)\n"
                    ,pcStack_20);
            fprintf(_stderr,"Try `%s --help\' for more information.\n",*argv);
            argv_local._4_4_ = -2;
          }
        }
        else {
          fprintf(_stderr,
                  "Invalid value for option dims (should be equal to 2 or 3, but equal to %d)\n",
                  (ulong)local_24);
          fprintf(_stderr,"Try `%s --help\' for more information.\n",*argv);
          argv_local._4_4_ = -2;
        }
        return argv_local._4_4_;
      }
    } while (uVar3 + 1 < 2);
    if ((uVar3 == 0x3a) || (uVar3 == 0x3f)) break;
    if (uVar3 == 99) {
      pcStack_20 = _optarg;
      printf("you entered \"%s\"\n",_optarg);
    }
    else if (uVar3 == 100) {
      local_24 = atoi(_optarg);
      printf("you entered \"%s\"\n",_optarg);
    }
    else if (uVar3 == 0x66) {
      strcpy(local_f8,_optarg);
      printf("you entered \"%s\"\n",_optarg);
    }
    else {
      if (uVar3 == 0x68) {
        printf("Usage: %s [OPTIONS]\n",*argv);
        printf(
              "  Option                  |  Description                                       | Default \n"
              );
        printf(
              "  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy\n"
              );
        printf(
              "  -d, --dims                number of dimmensions: 2 or 3                        2\n"
              );
        printf(
              "  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file\n"
              );
        printf(
              "  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file\n"
              );
        printf(
              "  -i, --interpolation_coef  time interpolation coefficient                       1.0\n"
              );
        printf("  -h, --help                print this help and exit\n");
        printf("Example: %s --segyfile seismo --csvfile input\n",*argv);
        printf("\n");
        return 0;
      }
      if (uVar3 == 0x69) {
        dVar8 = atof(_optarg);
        short_opt._4_4_ = (float)dVar8;
        printf("you entered \"%s\"\n",_optarg);
      }
      else {
        if (uVar3 != 0x73) {
          fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar3);
          fprintf(_stderr,"Try `%s --help\' for more information.\n",*argv);
          return -2;
        }
        strcpy((char *)&c,_optarg);
        printf("you entered \"%s\"\n",_optarg);
      }
    }
  }
  fprintf(_stderr,"Try `%s --help\' for more information.\n",*argv);
  return -2;
}

Assistant:

int main(int argc, char ** argv)
{
    char * convertion = "tosegy";
    int dims = 2;
    char csv_file[MAX_NAME_LENGTH] = "csv_file";
    char segy_file[MAX_NAME_LENGTH] = "segy_file";
    float interpolation_coef = 1.0;

    int c;
    opterr = 0;

    const char    * short_opt = "hc:d:f:s:i:";
    struct option   long_opt[] =
    {
        {"help",          no_argument,       NULL, 'h'},
        {"convertion",    required_argument, NULL, 'c'},
        {"dims",          required_argument, NULL, 'd'},
        {"csvfile",       required_argument, NULL, 'f'},
        {"segyfile",      required_argument, NULL, 's'},
        {"interpolation_coef",      required_argument, NULL, 'i'},
        {NULL,            0,                 NULL, 0  }
    };

    while((c = getopt_long(argc, argv, short_opt, long_opt, NULL)) != -1)
    {
        switch(c)
        {
            case -1:       /* no more arguments */
            case 0:        /* long options toggles */
            break;

            case 'c':
            convertion = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'd':
            dims = ::atoi(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'f':
            strcpy(csv_file, optarg);
            //csv_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 's':
            strcpy(segy_file, optarg);
            //segy_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'i':
            interpolation_coef = ::atof(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'h':
            printf("Usage: %s [OPTIONS]\n", argv[0]);
            printf("  Option                  |  Description                                       | Default \n");
            printf("  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy\n");
            printf("  -d, --dims                number of dimmensions: 2 or 3                        2\n");
            printf("  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file\n");
            printf("  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file\n");
            printf("  -i, --interpolation_coef  time interpolation coefficient                       1.0\n");
            printf("  -h, --help                print this help and exit\n");
            printf("Example: %s --segyfile seismo --csvfile input\n", argv[0]);
            printf("\n");
            return(0);

            case ':':
            case '?':
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);

            default:
            fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);
        };
    };
    if (dims != 2 && dims != 3)
    {
        fprintf(stderr, "Invalid value for option dims (should be equal to 2 or 3, but equal to %d)\n", dims);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }
    if (strcmp(convertion,"tosegy") != 0 && strcmp(convertion,"tocsv") != 0 )
    {
        fprintf(stderr, "Invalid value for option convertion (should be equal to \"tosegy\" or \"tocsv\", but equal to %s)\n", convertion);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }

    if (dims == 2)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        typedef CombinedSeismogramm<float, 2>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 2 > s = CombinedSeismogramm < float, 2 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 2>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 2>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
    }
    else if (dims == 3)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        char * segy_file_z = strdup(segy_file);
        strcat(segy_file_z, "_z.segy");
        typedef CombinedSeismogramm<float, 3>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 3 > s = CombinedSeismogramm < float, 3 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_z, new VzGetter<SeismoElastic, 3>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);
        segy_files.push_back(segy_file_z);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
        free(segy_file_z);
    }
    return 0;
}